

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O1

btScalar __thiscall btCollisionShape::getAngularMotionDisc(btCollisionShape *this)

{
  float fVar1;
  btScalar disc;
  btVector3 center;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  
  (*this->_vptr_btCollisionShape[3])(this,&local_18,&local_1c);
  fVar1 = local_10 * local_10 + local_18 * local_18 + local_14 * local_14;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  return fVar1 + local_1c;
}

Assistant:

btScalar	btCollisionShape::getAngularMotionDisc() const
{
	///@todo cache this value, to improve performance
	btVector3	center;
	btScalar disc;
	getBoundingSphere(center,disc);
	disc += (center).length();
	return disc;
}